

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

QVariant * __thiscall QAbstractSpinBoxPrivate::getZeroVariant(QAbstractSpinBoxPrivate *this)

{
  int iVar1;
  QVariant *in_RSI;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QVariant *ret;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)0x68bd45);
  iVar1 = *(int *)((long)&in_RSI[0x1c].d.data + 8);
  if (iVar1 == 2) {
    ::QVariant::QVariant(&local_28,0);
    ::QVariant::operator=(in_RSI,in_RDI);
    ::QVariant::~QVariant(&local_28);
  }
  else if (iVar1 == 6) {
    ::QVariant::QVariant(&local_48,0.0);
    ::QVariant::operator=(in_RSI,in_RDI);
    ::QVariant::~QVariant(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAbstractSpinBoxPrivate::getZeroVariant() const
{
    QVariant ret;
    switch (type) {
    case QMetaType::Int: ret = QVariant(0); break;
    case QMetaType::Double: ret = QVariant(0.0); break;
    default: break;
    }
    return ret;
}